

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

void __thiscall leveldb::DBImpl::~DBImpl(DBImpl *this)

{
  Mutex *this_00;
  VersionSet *this_01;
  WriteBatch *this_02;
  Writer *this_03;
  TableCache *this_04;
  Logger *pLVar1;
  Cache *pCVar2;
  char *pcVar3;
  pointer pcVar4;
  void *in_RAX;
  void *local_28;
  
  (this->super_DB)._vptr_DB = (_func_int **)&PTR__DBImpl_00131f60;
  this_00 = &this->mutex_;
  local_28 = in_RAX;
  port::Mutex::Lock(this_00);
  (this->shutting_down_).rep_ = this;
  while (this->bg_compaction_scheduled_ == true) {
    port::CondVar::Wait(&this->bg_cv_);
  }
  port::Mutex::Unlock(this_00);
  if (this->db_lock_ != (FileLock *)0x0) {
    (*this->env_->_vptr_Env[0xe])(&local_28);
    if (local_28 != (void *)0x0) {
      operator_delete__(local_28);
    }
  }
  this_01 = this->versions_;
  if (this_01 != (VersionSet *)0x0) {
    VersionSet::~VersionSet(this_01);
  }
  operator_delete(this_01);
  if (this->mem_ != (MemTable *)0x0) {
    MemTable::Unref(this->mem_);
  }
  if (this->imm_ != (MemTable *)0x0) {
    MemTable::Unref(this->imm_);
  }
  this_02 = this->tmp_batch_;
  if (this_02 != (WriteBatch *)0x0) {
    WriteBatch::~WriteBatch(this_02);
  }
  operator_delete(this_02);
  this_03 = this->log_;
  if (this_03 != (Writer *)0x0) {
    log::Writer::~Writer(this_03);
  }
  operator_delete(this_03);
  if (this->logfile_ != (WritableFile *)0x0) {
    (*this->logfile_->_vptr_WritableFile[1])();
  }
  this_04 = this->table_cache_;
  if (this_04 != (TableCache *)0x0) {
    TableCache::~TableCache(this_04);
  }
  operator_delete(this_04);
  if ((this->owns_info_log_ == true) &&
     (pLVar1 = (this->options_).info_log, pLVar1 != (Logger *)0x0)) {
    (*pLVar1->_vptr_Logger[1])();
  }
  if ((this->owns_cache_ == true) && (pCVar2 = (this->options_).block_cache, pCVar2 != (Cache *)0x0)
     ) {
    (*pCVar2->_vptr_Cache[1])();
  }
  pcVar3 = (this->bg_error_).state_;
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&(this->pending_outputs_)._M_t);
  std::_Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
  ~_Deque_base(&(this->writers_).
                super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
              );
  port::CondVar::~CondVar(&this->bg_cv_);
  port::Mutex::~Mutex(this_00);
  pcVar4 = (this->dbname_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(this->dbname_).field_2) {
    operator_delete(pcVar4);
  }
  FilterPolicy::~FilterPolicy(&(this->internal_filter_policy_).super_FilterPolicy);
  Comparator::~Comparator(&(this->internal_comparator_).super_Comparator);
  return;
}

Assistant:

DBImpl::~DBImpl() {
  // Wait for background work to finish
  mutex_.Lock();
  shutting_down_.Release_Store(this);  // Any non-NULL value is ok
  while (bg_compaction_scheduled_) {
    bg_cv_.Wait();
  }
  mutex_.Unlock();

  if (db_lock_!=NULL) {
    env_->UnlockFile(db_lock_);
  }

  delete versions_;
  if (mem_!=NULL) mem_->Unref();
  if (imm_!=NULL) imm_->Unref();
  delete tmp_batch_;
  delete log_;
  delete logfile_;
  delete table_cache_;

  if (owns_info_log_) {
    delete options_.info_log;
  }
  if (owns_cache_) {
    delete options_.block_cache;
  }
}